

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Path * __thiscall Path::parentDir(Path *__return_storage_ptr__,Path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  string *psVar3;
  char cVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  __off_t __length;
  uint uVar7;
  uint uVar8;
  string local_50;
  
  sVar2 = (this->super_String).mString._M_string_length;
  if (sVar2 == 1) {
    cVar4 = String::at(&this->super_String,0);
    if (cVar4 != '/') goto LAB_00170e9e;
  }
  else if (sVar2 != 0) {
LAB_00170e9e:
    std::__cxx11::string::string((string *)&local_50,(string *)this);
    psVar3 = &local_50;
    uVar8 = (uint)local_50._M_string_length;
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 - 1;
      if ((int)uVar8 < 0) break;
      cVar4 = String::at((String *)&local_50,(ulong)(uVar8 & 0x7fffffff));
    } while (cVar4 == '/');
    do {
      uVar8 = uVar7;
      uVar7 = uVar8 - 1;
      if ((int)uVar7 < 0) {
        paVar6 = &(__return_storage_ptr__->super_String).mString.field_2;
        (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar6;
        psVar3 = &(__return_storage_ptr__->super_String).mString;
        goto LAB_00170f59;
      }
      cVar4 = String::at((String *)&local_50,(ulong)uVar7);
    } while (cVar4 != '/');
    String::truncate((String *)&local_50,(char *)(ulong)uVar8,__length);
    bVar5 = String::endsWith((String *)&local_50,'/',CaseSensitive);
    if (!bVar5) {
      __assert_fail("copy.endsWith(\'/\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp"
                    ,0x37,"Path Path::parentDir() const");
    }
    paVar1 = &(__return_storage_ptr__->super_String).mString.field_2;
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar1;
    paVar6 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar6) {
      paVar1->_M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->super_String).mString.field_2 + 8) =
           local_50.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = local_50._M_dataplus._M_p;
      (__return_storage_ptr__->super_String).mString.field_2._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->super_String).mString._M_string_length =
         CONCAT44(local_50._M_string_length._4_4_,(uint)local_50._M_string_length);
    local_50._M_dataplus._M_p = (pointer)paVar6;
LAB_00170f59:
    psVar3->_M_string_length = 0;
    paVar6->_M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_50);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
  (__return_storage_ptr__->super_String).mString._M_string_length = 0;
  (__return_storage_ptr__->super_String).mString.field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Path Path::parentDir() const
{
    if (isEmpty())
        return Path();
    if (size() == 1 && at(0) == '/')
        return Path();
    Path copy = *this;
    int i = copy.size() - 1;
    while (i >= 0 && copy.at(i) == '/')
        --i;
    while (i >= 0 && copy.at(i) != '/')
        --i;
    if (i < 0)
        return Path();
    copy.truncate(i + 1);
    assert(copy.endsWith('/'));
    return copy;
}